

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O3

int IPdr_ManCheckCubeReduce(Pdr_Man_t *p,Vec_Ptr_t *vClauses,Pdr_Set_t *pCube,int nConfLimit)

{
  uint *puVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  sat_solver *s;
  int *piVar4;
  Pdr_Set_t *p_00;
  int iVar5;
  int iVar6;
  lit *begin;
  undefined4 extraout_var;
  Vec_Int_t *p_01;
  int *__ptr;
  void *__dest;
  uint *__ptr_00;
  ulong uVar7;
  void **ppvVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  size_t __size;
  sat_solver *psVar13;
  ulong uVar14;
  uint uVar15;
  void *pvVar16;
  long lVar17;
  int Lit;
  timespec ts;
  int local_5c;
  timespec local_58;
  void *local_48;
  int local_3c;
  undefined8 local_38;
  
  iVar11 = 3;
  iVar5 = clock_gettime(3,&local_58);
  if (iVar5 < 0) {
    pvVar16 = (void *)0xffffffffffffffff;
  }
  else {
    pvVar16 = (void *)(local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000);
  }
  if (1 < p->vSolvers->nSize) {
    if (pCube == (Pdr_Set_t *)0x0) {
      iVar5 = p->iOutCur;
      if (((long)iVar5 < 0) || (pVVar3 = p->pAig->vCos, pVVar3->nSize <= iVar5)) goto LAB_00901b8b;
      s = (sat_solver *)p->vSolvers->pArray[1];
      iVar5 = Pdr_ObjSatVar(p,1,2,(Aig_Obj_t *)pVVar3->pArray[iVar5]);
      if (iVar5 < 0) {
LAB_00901ad1:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      local_5c = iVar5 * 2;
      iVar5 = sat_solver_addclause(s,&local_5c,(lit *)&local_58);
      if (iVar5 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                      ,0x385,
                      "int IPdr_ManCheckCubeReduce(Pdr_Man_t *, Vec_Ptr_t *, Pdr_Set_t *, int)");
      }
      iVar5 = vClauses->nSize;
      lVar17 = (long)iVar5;
      iVar11 = 0x10;
      if (0xe < iVar5 - 1U) {
        iVar11 = iVar5;
      }
      local_3c = nConfLimit;
      if ((iVar11 == 0) || (begin = (lit *)malloc((long)iVar11 << 2), begin == (lit *)0x0)) {
        begin = (lit *)0x0;
      }
      else {
        memset(begin,0,lVar17 * 4);
      }
      iVar11 = 1;
      local_48 = pvVar16;
      iVar5 = Pdr_ManFreeVar(p,1);
      local_38 = CONCAT44(extraout_var,iVar5);
      iVar5 = vClauses->nSize;
      if (1 < iVar5) {
        do {
          Pdr_ManFreeVar(p,1);
          iVar11 = iVar11 + 1;
          iVar5 = vClauses->nSize;
        } while (iVar11 < iVar5);
      }
      if (0 < iVar5) {
        iVar5 = (int)local_38;
        iVar11 = iVar5 * 2;
        lVar12 = 0;
        do {
          p_01 = Pdr_ManCubeToLits(p,1,(Pdr_Set_t *)vClauses->pArray[lVar12],1,0);
          if (iVar5 + (int)lVar12 < 0) goto LAB_00901ad1;
          local_5c = iVar11 + 1;
          Vec_IntPush(p_01,local_5c);
          iVar6 = sat_solver_addclause(s,p_01->pArray,p_01->pArray + p_01->nSize);
          if (iVar6 != 1) {
            __assert_fail("RetValue == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                          ,0x392,
                          "int IPdr_ManCheckCubeReduce(Pdr_Man_t *, Vec_Ptr_t *, Pdr_Set_t *, int)")
            ;
          }
          if (lVar17 <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          begin[lVar12] = iVar11;
          lVar12 = lVar12 + 1;
          iVar11 = iVar11 + 2;
        } while (lVar12 < vClauses->nSize);
      }
      if ((s->qtail != s->qhead) && (iVar5 = sat_solver_simplify(s), iVar5 == 0)) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x102,"void sat_solver_compress(sat_solver *)");
      }
      psVar13 = s;
      iVar5 = sat_solver_solve(s,begin,begin + lVar17,(long)local_3c,0,0,0);
      pvVar16 = local_48;
      iVar11 = (int)psVar13;
      if (begin != (lit *)0x0) {
        free(begin);
        iVar11 = (int)begin;
      }
      if (iVar5 == 0) {
        return -1;
      }
      if (iVar5 == -1) {
        uVar2 = (s->conf_final).size;
        piVar4 = (s->conf_final).ptr;
        Abc_Print(iVar11,"UNSAT at the last frame. nCores = %d (out of %d).",(ulong)uVar2,
                  (ulong)(uint)vClauses->nSize);
        iVar11 = 3;
        iVar5 = clock_gettime(3,&local_58);
        if (iVar5 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
        }
        __dest = (void *)0x0;
        Abc_Print(iVar11,"%s =","    Time");
        Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar17 - (long)pvVar16) / 1000000.0);
        __ptr = (int *)malloc(0x10);
        iVar5 = vClauses->nSize;
        uVar10 = (ulong)iVar5;
        __ptr[1] = iVar5;
        iVar11 = vClauses->nCap;
        *__ptr = iVar11;
        if ((long)iVar11 != 0) {
          __dest = malloc((long)iVar11 << 3);
        }
        *(void **)(__ptr + 2) = __dest;
        local_48 = __dest;
        memcpy(__dest,vClauses->pArray,uVar10 * 8);
        iVar11 = ((iVar5 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
        __ptr_00 = (uint *)malloc(0x10);
        uVar15 = iVar11 * 0x20;
        *__ptr_00 = uVar15;
        if (iVar11 == 0) {
          __size = 0;
          pvVar16 = (void *)0x0;
        }
        else {
          __size = (long)iVar11 << 2;
          pvVar16 = malloc(__size);
        }
        *(void **)(__ptr_00 + 2) = pvVar16;
        __ptr_00[1] = uVar15;
        memset(pvVar16,0,__size);
        vClauses->nSize = 0;
        if (0 < (int)uVar2) {
          uVar7 = 0;
          do {
            uVar9 = piVar4[uVar7];
            if ((int)uVar9 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar9 = (uVar9 >> 1) - (int)local_38;
            if (((int)uVar9 < 0) || ((int)uVar15 <= (int)uVar9)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
            }
            puVar1 = (uint *)((long)pvVar16 + (ulong)(uVar9 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)uVar9 & 0x1f);
            uVar7 = uVar7 + 1;
          } while (uVar2 != uVar7);
        }
        pvVar16 = local_48;
        if (0 < iVar5) {
          uVar14 = 0;
          uVar7 = (ulong)uVar15;
          if (iVar11 * 0x20 < 1) {
            uVar7 = uVar14;
          }
          do {
            if (uVar7 == uVar14) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            p_00 = *(Pdr_Set_t **)(*(long *)(__ptr + 2) + uVar14 * 8);
            if ((*(uint *)(*(long *)(__ptr_00 + 2) + (uVar14 >> 5 & 0x7ffffff) * 4) >>
                 ((uint)uVar14 & 0x1f) & 1) == 0) {
              Pdr_SetDeref(p_00);
            }
            else {
              uVar2 = vClauses->nSize;
              if (uVar2 == vClauses->nCap) {
                if ((int)uVar2 < 0x10) {
                  if (vClauses->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vClauses->pArray,0x80);
                  }
                  vClauses->pArray = ppvVar8;
                  vClauses->nCap = 0x10;
                }
                else {
                  if (vClauses->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vClauses->pArray,(ulong)uVar2 << 4);
                  }
                  vClauses->pArray = ppvVar8;
                  vClauses->nCap = uVar2 * 2;
                }
              }
              else {
                ppvVar8 = vClauses->pArray;
              }
              iVar5 = vClauses->nSize;
              vClauses->nSize = iVar5 + 1;
              ppvVar8[iVar5] = p_00;
            }
            uVar14 = uVar14 + 1;
          } while (uVar10 != uVar14);
          pvVar16 = *(void **)(__ptr + 2);
        }
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
        }
        free(__ptr);
        if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
          free(*(void **)(__ptr_00 + 2));
        }
        free(__ptr_00);
        return 1;
      }
    }
    Abc_Print(iVar11,"SAT at the last frame.");
    iVar11 = 3;
    iVar5 = clock_gettime(3,&local_58);
    if (iVar5 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Abc_Print(iVar11,"%s =","    Time");
    Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar17 - (long)pvVar16) / 1000000.0);
    return 0;
  }
LAB_00901b8b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int IPdr_ManCheckCubeReduce( Pdr_Man_t * p, Vec_Ptr_t * vClauses, Pdr_Set_t * pCube, int nConfLimit )
{ 
    sat_solver * pSat;
    Vec_Int_t * vLits, * vLitsA;
    int Lit, RetValue = l_True;
    int i;
    Pdr_Set_t * pCla;
    int iActVar = 0;
    abctime clk = Abc_Clock();

    pSat = Pdr_ManSolver( p, 1 );

    if ( pCube == NULL ) // solve the property
    {
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p, 1, 2, Aig_ManCo(p->pAig, p->iOutCur)), 0 ); // pos literal (property fails)
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );
        assert( RetValue == 1 );

        vLitsA = Vec_IntStart( Vec_PtrSize( vClauses ) );
        iActVar = Pdr_ManFreeVar( p, 1 );
        for ( i = 1; i < Vec_PtrSize( vClauses ); ++i )
            Pdr_ManFreeVar( p, 1 );
        Vec_PtrForEachEntry( Pdr_Set_t *, vClauses, pCla, i )
        {
            vLits = Pdr_ManCubeToLits( p, 1, pCla, 1, 0 );
            Lit = Abc_Var2Lit( iActVar + i, 1 );
            Vec_IntPush( vLits, Lit );

            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            Vec_IntWriteEntry( vLitsA, i, Abc_Var2Lit( iActVar + i, 0 )  );
        }
        sat_solver_compress( pSat );

        // solve 
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLitsA), Vec_IntArray(vLitsA) + Vec_IntSize(vLitsA), nConfLimit, 0, 0, 0 );
        Vec_IntFree( vLitsA );

        if ( RetValue == l_Undef )
            return -1;
    }

    assert( RetValue != l_Undef );
    if ( RetValue == l_False ) // UNSAT
    {
        int ncorelits, *pcorelits;
        Vec_Ptr_t * vTemp = NULL;
        Vec_Bit_t * vMark = NULL;

        ncorelits = sat_solver_final(pSat, &pcorelits);
        Abc_Print( 1, "UNSAT at the last frame. nCores = %d (out of %d).", ncorelits, Vec_PtrSize( vClauses ) );
        Abc_PrintTime( 1, "    Time", Abc_Clock() - clk );

        vTemp = Vec_PtrDup( vClauses );
        vMark = Vec_BitStart( Vec_PtrSize( vClauses) );
        Vec_PtrClear( vClauses );
        for ( i = 0; i < ncorelits; ++i )
        {
            //Abc_Print( 1, "Core[%d] = lit(%d) = var(%d) = %d-th set\n", i, pcorelits[i], Abc_Lit2Var(pcorelits[i]), Abc_Lit2Var(pcorelits[i]) - iActVar );
            Vec_BitWriteEntry( vMark, Abc_Lit2Var( pcorelits[i] ) - iActVar, 1 );
        }
        
        Vec_PtrForEachEntry( Pdr_Set_t *, vTemp, pCla, i )
        {
            if ( Vec_BitEntry( vMark, i ) )
            { 
                Vec_PtrPush( vClauses, pCla );
                continue;
            }
            Pdr_SetDeref( pCla );
        }

        Vec_PtrFree( vTemp );
        Vec_BitFree( vMark );
        RetValue = 1;
    }
    else // SAT
    {
        Abc_Print( 1, "SAT at the last frame." );
        Abc_PrintTime( 1, "    Time", Abc_Clock() - clk );
        RetValue = 0;
    }

    return RetValue;
}